

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

StringBuilder * __thiscall Potassco::StringBuilder::append(StringBuilder *this,size_t n,char c)

{
  ulong __n;
  Buffer buf;
  Buffer local_40;
  
  if (((this->field_0).sbo_[0x3f] & 0xc0U) == 0x40) {
    std::__cxx11::string::_M_replace_aux
              ((ulong)(this->field_0).str_,((this->field_0).str_)->_M_string_length,0,(char)n);
  }
  else {
    grow(&local_40,this,n);
    __n = local_40.size - local_40.used;
    if (n <= local_40.size - local_40.used) {
      __n = n;
    }
    memset(local_40.head + local_40.used,(uint)(byte)c,__n);
    (local_40.head + local_40.used)[__n] = '\0';
  }
  return this;
}

Assistant:

StringBuilder& StringBuilder::append(std::size_t n, char c) {
	if (type() == Str) {
		str_->append(n, c);
	}
	else {
		Buffer buf = grow(n);
		std::memset(buf.pos(), static_cast<int>(c), n = std::min(n, buf.free()));
		buf.pos()[n] = 0;
	}
	return *this;
}